

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msg32,
              secp256k1_pubkey *pubkey)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  int iVar69;
  uint uVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  bool bVar89;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_fe xr;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  uchar c [32];
  secp256k1_scalar m;
  secp256k1_scalar u2;
  secp256k1_gej pubkeyj;
  secp256k1_scalar local_298;
  secp256k1_scalar local_278;
  secp256k1_ge local_258;
  secp256k1_fe local_200;
  secp256k1_scalar local_1d8;
  secp256k1_scalar local_1b8;
  uchar local_198 [32];
  secp256k1_scalar local_178;
  secp256k1_scalar local_158;
  undefined1 local_138 [64];
  uint64_t uStack_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t uStack_d8;
  uint64_t local_d0;
  uint64_t uStack_c8;
  int local_c0;
  secp256k1_gej local_b0;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ecdsa_verify_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(&local_178,msg32,(int *)0x0);
    local_278.d[0] = *(uint64_t *)sig->data;
    local_278.d[1] = *(uint64_t *)(sig->data + 8);
    local_278.d[2] = *(uint64_t *)(sig->data + 0x10);
    local_278.d[3] = *(uint64_t *)(sig->data + 0x18);
    local_298.d[0] = *(uint64_t *)(sig->data + 0x20);
    local_298.d[1] = *(uint64_t *)(sig->data + 0x28);
    local_298.d[2] = *(uint64_t *)(sig->data + 0x30);
    local_298.d[3] = *(uint64_t *)(sig->data + 0x38);
    uVar68 = -(int)((long)local_298.d[3] >> 0x3f);
    uVar72 = uVar68 ^ 1;
    uVar70 = uVar72;
    if (local_298.d[2] == 0xffffffffffffffff) {
      uVar70 = 0;
    }
    if (0x5d576e7357a4501c < local_298.d[1]) {
      uVar72 = 0;
    }
    uVar72 = (uVar72 | uVar70 | local_298.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar70 = 0;
    if (0xdfe92f46681b20a0 < local_298.d[0]) {
      uVar70 = uVar72;
    }
    if (0x5d576e7357a4501d < local_298.d[1]) {
      uVar70 = uVar72;
    }
    if (uVar70 != 0 || uVar68 != 0) {
      return 0;
    }
    iVar69 = secp256k1_pubkey_load(ctx,&local_258,pubkey);
    if (iVar69 == 0) {
      return 0;
    }
    if ((((local_278.d[1] != 0 || local_278.d[0] != 0) || local_278.d[2] != 0) ||
         local_278.d[3] != 0) &&
       (((local_298.d[1] != 0 || local_298.d[0] != 0) || local_298.d[2] != 0) || local_298.d[3] != 0
       )) {
      secp256k1_scalar_inverse(&local_1b8,&local_298);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1b8.d[0];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_178.d[0];
      uVar73 = SUB168(auVar1 * auVar33,8);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar73;
      local_138._0_8_ = SUB168(auVar1 * auVar33,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1b8.d[0];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_178.d[1];
      auVar2 = auVar2 * auVar34;
      uVar78 = SUB168(auVar2 + auVar66,0);
      uVar83 = SUB168(auVar2 + auVar66,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1b8.d[1];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_178.d[0];
      uVar74 = SUB168(auVar3 * auVar35,8);
      uVar71 = SUB168(auVar3 * auVar35,0);
      local_138._8_8_ = uVar78 + uVar71;
      uVar71 = (ulong)CARRY8(uVar78,uVar71);
      uVar78 = uVar83 + uVar74;
      uVar84 = uVar78 + uVar71;
      uVar85 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar73,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar83,uVar74) || CARRY8(uVar78,uVar71));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1b8.d[0];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_178.d[2];
      uVar75 = SUB168(auVar4 * auVar36,8);
      uVar71 = SUB168(auVar4 * auVar36,0);
      uVar73 = uVar84 + uVar71;
      uVar71 = (ulong)CARRY8(uVar84,uVar71);
      uVar74 = uVar85 + uVar75;
      uVar86 = uVar74 + uVar71;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1b8.d[1];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_178.d[1];
      uVar76 = SUB168(auVar5 * auVar37,8);
      uVar78 = SUB168(auVar5 * auVar37,0);
      uVar84 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar83 = uVar86 + uVar76;
      uVar87 = uVar83 + uVar78;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1b8.d[2];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_178.d[0];
      uVar77 = SUB168(auVar6 * auVar38,8);
      uVar73 = SUB168(auVar6 * auVar38,0);
      local_138._16_8_ = uVar84 + uVar73;
      uVar73 = (ulong)CARRY8(uVar84,uVar73);
      uVar84 = uVar87 + uVar77;
      uVar88 = uVar84 + uVar73;
      uVar79 = (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar74,uVar71)) +
               (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar83,uVar78)) +
               (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar84,uVar73));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1b8.d[0];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_178.d[3];
      uVar77 = SUB168(auVar7 * auVar39,8);
      uVar71 = SUB168(auVar7 * auVar39,0);
      uVar73 = uVar88 + uVar71;
      uVar71 = (ulong)CARRY8(uVar88,uVar71);
      uVar83 = uVar79 + uVar77;
      uVar88 = uVar83 + uVar71;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1b8.d[1];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_178.d[2];
      uVar85 = SUB168(auVar8 * auVar40,8);
      uVar78 = SUB168(auVar8 * auVar40,0);
      uVar74 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar84 = uVar88 + uVar85;
      uVar80 = uVar84 + uVar78;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1b8.d[2];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_178.d[1];
      uVar86 = SUB168(auVar9 * auVar41,8);
      uVar73 = SUB168(auVar9 * auVar41,0);
      uVar76 = uVar74 + uVar73;
      uVar73 = (ulong)CARRY8(uVar74,uVar73);
      uVar75 = uVar80 + uVar86;
      uVar81 = uVar75 + uVar73;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1b8.d[3];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_178.d[0];
      uVar87 = SUB168(auVar10 * auVar42,8);
      uVar74 = SUB168(auVar10 * auVar42,0);
      local_138._24_8_ = uVar76 + uVar74;
      uVar74 = (ulong)CARRY8(uVar76,uVar74);
      uVar76 = uVar81 + uVar87;
      uVar82 = uVar76 + uVar74;
      uVar85 = (ulong)(CARRY8(uVar79,uVar77) || CARRY8(uVar83,uVar71)) +
               (ulong)(CARRY8(uVar88,uVar85) || CARRY8(uVar84,uVar78)) +
               (ulong)(CARRY8(uVar80,uVar86) || CARRY8(uVar75,uVar73)) +
               (ulong)(CARRY8(uVar81,uVar87) || CARRY8(uVar76,uVar74));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1b8.d[1];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_178.d[3];
      uVar75 = SUB168(auVar11 * auVar43,8);
      uVar71 = SUB168(auVar11 * auVar43,0);
      uVar73 = uVar82 + uVar71;
      uVar71 = (ulong)CARRY8(uVar82,uVar71);
      uVar74 = uVar85 + uVar75;
      uVar86 = uVar74 + uVar71;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1b8.d[2];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_178.d[2];
      uVar76 = SUB168(auVar12 * auVar44,8);
      uVar78 = SUB168(auVar12 * auVar44,0);
      uVar84 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar83 = uVar86 + uVar76;
      uVar87 = uVar83 + uVar78;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1b8.d[3];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_178.d[1];
      uVar77 = SUB168(auVar13 * auVar45,8);
      uVar73 = SUB168(auVar13 * auVar45,0);
      local_138._32_8_ = uVar84 + uVar73;
      uVar73 = (ulong)CARRY8(uVar84,uVar73);
      uVar84 = uVar87 + uVar77;
      uVar79 = uVar84 + uVar73;
      uVar75 = (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar74,uVar71)) +
               (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar83,uVar78)) +
               (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar84,uVar73));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1b8.d[2];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_178.d[3];
      uVar83 = SUB168(auVar14 * auVar46,8);
      uVar71 = SUB168(auVar14 * auVar46,0);
      uVar74 = uVar79 + uVar71;
      uVar71 = (ulong)CARRY8(uVar79,uVar71);
      uVar73 = uVar75 + uVar83;
      uVar76 = uVar73 + uVar71;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1b8.d[3];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_178.d[2];
      uVar84 = SUB168(auVar15 * auVar47,8);
      uVar78 = SUB168(auVar15 * auVar47,0);
      local_138._40_8_ = uVar74 + uVar78;
      uVar78 = (ulong)CARRY8(uVar74,uVar78);
      uVar74 = uVar76 + uVar84;
      local_138._56_8_ =
           (ulong)(CARRY8(uVar75,uVar83) || CARRY8(uVar73,uVar71)) +
           (ulong)(CARRY8(uVar76,uVar84) || CARRY8(uVar74,uVar78));
      local_138._48_8_ = uVar74 + uVar78;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1b8.d[3];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_178.d[3];
      local_138._48_16_ = auVar16 * auVar48 + local_138._48_16_;
      secp256k1_scalar_reduce_512(&local_1d8,(uint64_t *)local_138);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1b8.d[0];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_278.d[0];
      uVar73 = SUB168(auVar17 * auVar49,8);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar73;
      local_138._0_8_ = SUB168(auVar17 * auVar49,0);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_1b8.d[0];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_278.d[1];
      auVar18 = auVar18 * auVar50;
      uVar78 = SUB168(auVar18 + auVar67,0);
      uVar83 = SUB168(auVar18 + auVar67,8);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_1b8.d[1];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_278.d[0];
      uVar74 = SUB168(auVar19 * auVar51,8);
      uVar71 = SUB168(auVar19 * auVar51,0);
      local_138._8_8_ = uVar78 + uVar71;
      uVar71 = (ulong)CARRY8(uVar78,uVar71);
      uVar78 = uVar83 + uVar74;
      uVar84 = uVar78 + uVar71;
      uVar85 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar73,auVar18._0_8_)) +
               (ulong)(CARRY8(uVar83,uVar74) || CARRY8(uVar78,uVar71));
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_1b8.d[0];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_278.d[2];
      uVar75 = SUB168(auVar20 * auVar52,8);
      uVar71 = SUB168(auVar20 * auVar52,0);
      uVar73 = uVar84 + uVar71;
      uVar71 = (ulong)CARRY8(uVar84,uVar71);
      uVar74 = uVar85 + uVar75;
      uVar86 = uVar74 + uVar71;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_1b8.d[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_278.d[1];
      uVar76 = SUB168(auVar21 * auVar53,8);
      uVar78 = SUB168(auVar21 * auVar53,0);
      uVar84 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar83 = uVar86 + uVar76;
      uVar87 = uVar83 + uVar78;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_1b8.d[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_278.d[0];
      uVar77 = SUB168(auVar22 * auVar54,8);
      uVar73 = SUB168(auVar22 * auVar54,0);
      local_138._16_8_ = uVar84 + uVar73;
      uVar73 = (ulong)CARRY8(uVar84,uVar73);
      uVar84 = uVar87 + uVar77;
      uVar88 = uVar84 + uVar73;
      uVar79 = (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar74,uVar71)) +
               (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar83,uVar78)) +
               (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar84,uVar73));
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_1b8.d[0];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_278.d[3];
      uVar77 = SUB168(auVar23 * auVar55,8);
      uVar71 = SUB168(auVar23 * auVar55,0);
      uVar73 = uVar88 + uVar71;
      uVar71 = (ulong)CARRY8(uVar88,uVar71);
      uVar83 = uVar79 + uVar77;
      uVar88 = uVar83 + uVar71;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_1b8.d[1];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_278.d[2];
      uVar85 = SUB168(auVar24 * auVar56,8);
      uVar78 = SUB168(auVar24 * auVar56,0);
      uVar74 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar84 = uVar88 + uVar85;
      uVar80 = uVar84 + uVar78;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_1b8.d[2];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_278.d[1];
      uVar86 = SUB168(auVar25 * auVar57,8);
      uVar73 = SUB168(auVar25 * auVar57,0);
      uVar76 = uVar74 + uVar73;
      uVar73 = (ulong)CARRY8(uVar74,uVar73);
      uVar75 = uVar80 + uVar86;
      uVar81 = uVar75 + uVar73;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_1b8.d[3];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_278.d[0];
      uVar87 = SUB168(auVar26 * auVar58,8);
      uVar74 = SUB168(auVar26 * auVar58,0);
      local_138._24_8_ = uVar76 + uVar74;
      uVar74 = (ulong)CARRY8(uVar76,uVar74);
      uVar76 = uVar81 + uVar87;
      uVar82 = uVar76 + uVar74;
      uVar85 = (ulong)(CARRY8(uVar79,uVar77) || CARRY8(uVar83,uVar71)) +
               (ulong)(CARRY8(uVar88,uVar85) || CARRY8(uVar84,uVar78)) +
               (ulong)(CARRY8(uVar80,uVar86) || CARRY8(uVar75,uVar73)) +
               (ulong)(CARRY8(uVar81,uVar87) || CARRY8(uVar76,uVar74));
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_1b8.d[1];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_278.d[3];
      uVar75 = SUB168(auVar27 * auVar59,8);
      uVar71 = SUB168(auVar27 * auVar59,0);
      uVar73 = uVar82 + uVar71;
      uVar71 = (ulong)CARRY8(uVar82,uVar71);
      uVar74 = uVar85 + uVar75;
      uVar86 = uVar74 + uVar71;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_1b8.d[2];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_278.d[2];
      uVar76 = SUB168(auVar28 * auVar60,8);
      uVar78 = SUB168(auVar28 * auVar60,0);
      uVar84 = uVar73 + uVar78;
      uVar78 = (ulong)CARRY8(uVar73,uVar78);
      uVar83 = uVar86 + uVar76;
      uVar87 = uVar83 + uVar78;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_1b8.d[3];
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_278.d[1];
      uVar77 = SUB168(auVar29 * auVar61,8);
      uVar73 = SUB168(auVar29 * auVar61,0);
      local_138._32_8_ = uVar84 + uVar73;
      uVar73 = (ulong)CARRY8(uVar84,uVar73);
      uVar84 = uVar87 + uVar77;
      uVar79 = uVar84 + uVar73;
      uVar75 = (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar74,uVar71)) +
               (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar83,uVar78)) +
               (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar84,uVar73));
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_1b8.d[2];
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_278.d[3];
      uVar83 = SUB168(auVar30 * auVar62,8);
      uVar71 = SUB168(auVar30 * auVar62,0);
      uVar74 = uVar79 + uVar71;
      uVar71 = (ulong)CARRY8(uVar79,uVar71);
      uVar73 = uVar75 + uVar83;
      uVar76 = uVar73 + uVar71;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_1b8.d[3];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_278.d[2];
      uVar84 = SUB168(auVar31 * auVar63,8);
      uVar78 = SUB168(auVar31 * auVar63,0);
      local_138._40_8_ = uVar74 + uVar78;
      uVar78 = (ulong)CARRY8(uVar74,uVar78);
      uVar74 = uVar76 + uVar84;
      auVar65._8_8_ =
           (ulong)(CARRY8(uVar75,uVar83) || CARRY8(uVar73,uVar71)) +
           (ulong)(CARRY8(uVar76,uVar84) || CARRY8(uVar74,uVar78));
      auVar65._0_8_ = uVar74 + uVar78;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_1b8.d[3];
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_278.d[3];
      local_138._48_16_ = auVar32 * auVar64 + auVar65;
      secp256k1_scalar_reduce_512(&local_158,(uint64_t *)local_138);
      local_c0 = local_258.infinity;
      local_138._0_8_ = local_258.x.n[0];
      local_138._8_8_ = local_258.x.n[1];
      local_138._16_8_ = local_258.x.n[2];
      local_138._24_8_ = local_258.x.n[3];
      local_138._32_8_ = local_258.x.n[4];
      local_138._40_8_ = local_258.y.n[0];
      uStack_f8 = local_258.y.n[3];
      local_f0 = local_258.y.n[4];
      local_e8 = 1;
      local_e0 = 0;
      uStack_d8 = 0;
      local_d0 = 0;
      uStack_c8 = 0;
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_b0,(secp256k1_gej *)local_138,&local_158,&local_1d8);
      if (local_b0.infinity == 0) {
        secp256k1_scalar_get_b32(local_198,&local_278);
        secp256k1_fe_set_b32(&local_200,local_198);
        iVar69 = secp256k1_gej_eq_x_var(&local_200,&local_b0);
        if (iVar69 != 0) {
          return 1;
        }
        uVar70 = 4;
        do {
          uVar71 = secp256k1_ecdsa_const_p_minus_order.n[uVar70];
          uVar78 = local_200.n[uVar70];
          if (uVar78 >= uVar71 && uVar78 != uVar71) {
            return 0;
          }
          if (uVar78 < uVar71) {
            local_200.n[0] = local_200.n[0] + 0x25e8cd0364141;
            local_200.n[1] = local_200.n[1] + 0xe6af48a03bbfd;
            local_200.n[2] = local_200.n[2] + 0xffffffebaaedc;
            local_200.n[3] = local_200.n[3] + 0xfffffffffffff;
            local_200.n[4] = local_200.n[4] + 0xffffffffffff;
            iVar69 = secp256k1_gej_eq_x_var(&local_200,&local_b0);
            return iVar69;
          }
          bVar89 = uVar70 != 0;
          uVar70 = uVar70 - 1;
        } while (bVar89);
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msg32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msg32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&ctx->ecmult_ctx, &r, &s, &q, &m));
}